

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timer.c++
# Opt level: O0

Maybe<kj::Absolute<kj::Quantity<long,_kj::_::NanosecondLabel>,_kj::_::TimeLabel>_> __thiscall
kj::TimerImpl::nextEvent(TimerImpl *this)

{
  bool bVar1;
  multiset<kj::TimerImpl::TimerPromiseAdapter_*,_kj::TimerImpl::Impl::TimerBefore,_std::allocator<kj::TimerImpl::TimerPromiseAdapter_*>_>
  *pmVar2;
  reference ppTVar3;
  anon_union_8_1_a8c68091_for_NullableValue<kj::Absolute<kj::Quantity<long,_kj::_::NanosecondLabel>,_kj::_::TimeLabel>_>_2
  extraout_RDX;
  anon_union_8_1_a8c68091_for_NullableValue<kj::Absolute<kj::Quantity<long,_kj::_::NanosecondLabel>,_kj::_::TimeLabel>_>_2
  extraout_RDX_00;
  anon_union_8_1_a8c68091_for_NullableValue<kj::Absolute<kj::Quantity<long,_kj::_::NanosecondLabel>,_kj::_::TimeLabel>_>_2
  aVar4;
  long in_RSI;
  Maybe<kj::Absolute<kj::Quantity<long,_kj::_::NanosecondLabel>,_kj::_::TimeLabel>_> MVar5;
  _Self local_28;
  _Self local_20;
  iterator iter;
  TimerImpl *this_local;
  
  pmVar2 = &Own<kj::TimerImpl::Impl,_std::nullptr_t>::operator->
                      ((Own<kj::TimerImpl::Impl,_std::nullptr_t> *)(in_RSI + 0x10))->timers;
  local_20._M_node =
       (_Base_ptr)
       std::
       multiset<kj::TimerImpl::TimerPromiseAdapter_*,_kj::TimerImpl::Impl::TimerBefore,_std::allocator<kj::TimerImpl::TimerPromiseAdapter_*>_>
       ::begin(pmVar2);
  pmVar2 = &Own<kj::TimerImpl::Impl,_std::nullptr_t>::operator->
                      ((Own<kj::TimerImpl::Impl,_std::nullptr_t> *)(in_RSI + 0x10))->timers;
  local_28._M_node =
       (_Base_ptr)
       std::
       multiset<kj::TimerImpl::TimerPromiseAdapter_*,_kj::TimerImpl::Impl::TimerBefore,_std::allocator<kj::TimerImpl::TimerPromiseAdapter_*>_>
       ::end(pmVar2);
  bVar1 = std::operator==(&local_20,&local_28);
  if (bVar1) {
    Maybe<kj::Absolute<kj::Quantity<long,_kj::_::NanosecondLabel>,_kj::_::TimeLabel>_>::Maybe
              ((Maybe<kj::Absolute<kj::Quantity<long,_kj::_::NanosecondLabel>,_kj::_::TimeLabel>_> *
               )this);
    aVar4 = extraout_RDX;
  }
  else {
    ppTVar3 = std::_Rb_tree_const_iterator<kj::TimerImpl::TimerPromiseAdapter_*>::operator*
                        (&local_20);
    Maybe<kj::Absolute<kj::Quantity<long,_kj::_::NanosecondLabel>,_kj::_::TimeLabel>_>::Maybe
              ((Maybe<kj::Absolute<kj::Quantity<long,_kj::_::NanosecondLabel>,_kj::_::TimeLabel>_> *
               )this,&(*ppTVar3)->time);
    aVar4 = extraout_RDX_00;
  }
  MVar5.ptr.field_1 = aVar4;
  MVar5.ptr._0_8_ = this;
  return (Maybe<kj::Absolute<kj::Quantity<long,_kj::_::NanosecondLabel>,_kj::_::TimeLabel>_>)
         MVar5.ptr;
}

Assistant:

Maybe<TimePoint> TimerImpl::nextEvent() {
  auto iter = impl->timers.begin();
  if (iter == impl->timers.end()) {
    return kj::none;
  } else {
    return (*iter)->time;
  }
}